

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx::create_pipeline
          (DeconvolutionDepthWise_x86_avx *this,Option *opt)

{
  int *piVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  undefined8 *puVar5;
  byte *in_RSI;
  long *in_RDI;
  Mat weight_data_r2_1;
  Mat weight_data_r2;
  int k;
  int i;
  float *p;
  float *pt;
  Mat weight_data_transposed;
  int elempack;
  int channels;
  int maxk;
  Allocator *in_stack_fffffffffffffd28;
  void **ppvVar6;
  size_t in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd38;
  void **ppvVar7;
  Mat *in_stack_fffffffffffffd40;
  Option *in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd54;
  Mat *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  int iVar8;
  int local_27c;
  Allocator *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  Mat *in_stack_fffffffffffffda8;
  long *local_248;
  Mat local_220;
  int local_1d8;
  int local_1d4;
  long local_1d0;
  void *local_1b8;
  void *local_1b0;
  int *local_1a8;
  undefined8 local_1a0;
  undefined4 local_198;
  long *local_190;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 local_178;
  undefined8 local_170;
  int local_164;
  int local_160;
  int local_15c;
  byte *local_158;
  int local_144;
  undefined8 local_140;
  undefined8 local_138;
  undefined4 local_12c;
  void **local_128;
  void **local_120;
  long *local_118;
  Mat *local_110;
  undefined8 *local_100;
  void **local_f0;
  int local_e0;
  undefined4 local_dc;
  void **local_d8;
  void **local_d0;
  void **local_c8;
  int local_c0;
  undefined4 local_bc;
  void **local_b8;
  int local_a0;
  undefined4 local_9c;
  void **local_98;
  int local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  int local_60;
  undefined4 local_5c;
  Mat *local_58;
  int local_50;
  undefined4 local_4c;
  undefined8 *local_48;
  void *local_40;
  void *local_18;
  void *local_8;
  
  local_15c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
  uVar4 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x110) /
          (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114);
  local_160 = ((int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                    (long)local_15c) /
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114))) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114);
  if ((local_160 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114)) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114) ==
      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0))) {
    local_164 = 1;
    if ((in_RSI[0x27] & 1) != 0) {
      if (local_160 % 8 == 0) {
        local_27c = 8;
      }
      else {
        local_27c = 1;
        if (local_160 % 4 == 0) {
          local_27c = 4;
        }
      }
      local_164 = local_27c;
    }
    local_12c = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x194);
    local_128 = &local_1b0;
    local_138 = 4;
    local_140 = 0;
    local_1b0 = (void *)0x0;
    local_1a8 = (int *)0x0;
    local_1a0 = 0;
    local_198 = 0;
    local_190 = (long *)0x0;
    local_188 = 0;
    local_184 = 0;
    local_180 = 0;
    local_17c = 0;
    local_178 = 0;
    local_170 = 0;
    Mat::create(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    local_120 = &local_1b0;
    local_1b8 = local_1b0;
    local_118 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x168);
    local_1d0 = *local_118;
    for (local_1d4 = 0;
        local_1d4 <
        (local_160 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114)) *
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114)) *
        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114); local_1d4 = local_1d4 + 1) {
      for (local_1d8 = 0; local_1d8 < local_15c; local_1d8 = local_1d8 + 1) {
        *(undefined4 *)((long)local_1b8 + (long)((local_15c + -1) - local_1d8) * 4) =
             *(undefined4 *)(local_1d0 + (long)local_1d8 * 4);
      }
      local_1d0 = local_1d0 + (long)local_15c * 4;
      local_1b8 = (void *)((long)local_1b8 + (long)local_15c * 4);
    }
    iVar8 = local_1d4;
    if (local_164 == 8) {
      Mat::reshape(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,
                   in_stack_fffffffffffffd98);
      convert_packing((Mat *)CONCAT44(iVar8,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58,
                      in_stack_fffffffffffffd54,in_stack_fffffffffffffd48);
      in_stack_fffffffffffffd58 = &local_220;
      local_110 = in_stack_fffffffffffffd58;
      local_58 = in_stack_fffffffffffffd58;
      if (local_220.refcount != (int *)0x0) {
        local_5c = 0xffffffff;
        LOCK();
        local_60 = *local_220.refcount;
        *local_220.refcount = *local_220.refcount + -1;
        UNLOCK();
        if (local_60 == 1) {
          if (local_220.allocator == (Allocator *)0x0) {
            if (local_220.data != (void *)0x0) {
              free(local_220.data);
            }
          }
          else {
            (*(local_220.allocator)->_vptr_Allocator[3])(local_220.allocator,local_220.data);
          }
        }
      }
      in_stack_fffffffffffffd58->data = (void *)0x0;
      in_stack_fffffffffffffd58->elemsize = 0;
      in_stack_fffffffffffffd58->elempack = 0;
      in_stack_fffffffffffffd58->dims = 0;
      in_stack_fffffffffffffd58->w = 0;
      in_stack_fffffffffffffd58->h = 0;
      in_stack_fffffffffffffd58->d = 0;
      in_stack_fffffffffffffd58->c = 0;
      in_stack_fffffffffffffd58->cstep = 0;
      in_stack_fffffffffffffd58->refcount = (int *)0x0;
    }
    if (local_164 == 4) {
      Mat::reshape(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,
                   in_stack_fffffffffffffd98);
      convert_packing((Mat *)CONCAT44(iVar8,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58,
                      in_stack_fffffffffffffd54,in_stack_fffffffffffffd48);
      puVar5 = (undefined8 *)&stack0xfffffffffffffd98;
      local_100 = puVar5;
      local_78 = puVar5;
      if (CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0) != 0) {
        piVar1 = (int *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0);
        local_7c = 0xffffffff;
        LOCK();
        local_80 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_80 == 1) {
          if (local_248 == (long *)0x0) {
            if (in_stack_fffffffffffffd98 != (Allocator *)0x0) {
              free(in_stack_fffffffffffffd98);
            }
          }
          else {
            (**(code **)(*local_248 + 0x18))(local_248,in_stack_fffffffffffffd98);
          }
        }
      }
      *puVar5 = 0;
      puVar5[2] = 0;
      *(undefined4 *)(puVar5 + 3) = 0;
      *(undefined4 *)(puVar5 + 5) = 0;
      *(undefined4 *)((long)puVar5 + 0x2c) = 0;
      *(undefined4 *)(puVar5 + 6) = 0;
      *(undefined4 *)((long)puVar5 + 0x34) = 0;
      *(undefined4 *)(puVar5 + 7) = 0;
      puVar5[8] = 0;
      puVar5[1] = 0;
    }
    if (local_164 == 1) {
      ppvVar6 = (void **)(in_RDI + 4);
      local_d8 = &local_1b0;
      local_d0 = ppvVar6;
      local_c8 = ppvVar6;
      if (ppvVar6 != local_d8) {
        if (local_1a8 != (int *)0x0) {
          local_dc = 1;
          LOCK();
          local_e0 = *local_1a8;
          *local_1a8 = *local_1a8 + 1;
          UNLOCK();
        }
        ppvVar7 = ppvVar6;
        local_b8 = ppvVar6;
        if (in_RDI[5] != 0) {
          piVar1 = (int *)in_RDI[5];
          local_bc = 0xffffffff;
          LOCK();
          local_c0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_c0 == 1) {
            if (in_RDI[8] == 0) {
              local_8 = *ppvVar6;
              if (local_8 != (void *)0x0) {
                free(local_8);
              }
            }
            else {
              (**(code **)(*(long *)in_RDI[8] + 0x18))((long *)in_RDI[8],*ppvVar6);
            }
          }
        }
        *ppvVar6 = (void *)0x0;
        ppvVar6[2] = (void *)0x0;
        *(undefined4 *)(ppvVar6 + 3) = 0;
        *(undefined4 *)(ppvVar6 + 5) = 0;
        *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
        *(undefined4 *)(ppvVar6 + 6) = 0;
        *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
        *(undefined4 *)(ppvVar6 + 7) = 0;
        ppvVar6[8] = (void *)0x0;
        ppvVar6[1] = (void *)0x0;
        *ppvVar7 = *local_d8;
        ppvVar7[1] = local_d8[1];
        ppvVar7[2] = local_d8[2];
        *(undefined4 *)(ppvVar7 + 3) = *(undefined4 *)(local_d8 + 3);
        ppvVar7[4] = local_d8[4];
        *(undefined4 *)(ppvVar7 + 5) = *(undefined4 *)(local_d8 + 5);
        *(undefined4 *)((long)ppvVar7 + 0x2c) = *(undefined4 *)((long)local_d8 + 0x2c);
        *(undefined4 *)(ppvVar7 + 6) = *(undefined4 *)(local_d8 + 6);
        *(undefined4 *)((long)ppvVar7 + 0x34) = *(undefined4 *)((long)local_d8 + 0x34);
        *(undefined4 *)(ppvVar7 + 7) = *(undefined4 *)(local_d8 + 7);
        ppvVar7[8] = local_d8[8];
        local_c8 = ppvVar7;
      }
    }
    local_144 = 0;
    ppvVar6 = &local_1b0;
    if (local_1a8 != (int *)0x0) {
      local_9c = 0xffffffff;
      LOCK();
      local_a0 = *local_1a8;
      *local_1a8 = *local_1a8 + -1;
      UNLOCK();
      if (local_a0 == 1) {
        local_f0 = ppvVar6;
        local_98 = ppvVar6;
        if (local_190 == (long *)0x0) {
          local_18 = local_1b0;
          if (local_1b0 != (void *)0x0) {
            free(local_1b0);
          }
        }
        else {
          (**(code **)(*local_190 + 0x18))(local_190,local_1b0);
        }
      }
    }
    *ppvVar6 = (void *)0x0;
    ppvVar6[2] = (void *)0x0;
    *(undefined4 *)(ppvVar6 + 3) = 0;
    *(undefined4 *)(ppvVar6 + 5) = 0;
    *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
    *(undefined4 *)(ppvVar6 + 6) = 0;
    *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
    *(undefined4 *)(ppvVar6 + 7) = 0;
    ppvVar6[8] = (void *)0x0;
    ppvVar6[1] = (void *)0x0;
  }
  else {
    local_158 = in_RSI;
    create_group_ops((DeconvolutionDepthWise_x86_avx *)p,_k);
    if ((*local_158 & 1) != 0) {
      lVar2 = *(long *)(*in_RDI + -0x18);
      puVar5 = (undefined8 *)((long)in_RDI + lVar2 + 0x168);
      if (*(long *)((long)in_RDI + lVar2 + 0x170) != 0) {
        piVar1 = *(int **)((long)in_RDI + lVar2 + 0x170);
        local_4c = 0xffffffff;
        LOCK();
        local_50 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_50 == 1) {
          local_48 = puVar5;
          if (*(long *)((long)in_RDI + lVar2 + 0x188) == 0) {
            local_40 = (void *)*puVar5;
            if (local_40 != (void *)0x0) {
              free(local_40);
            }
          }
          else {
            plVar3 = *(long **)((long)in_RDI + lVar2 + 0x188);
            (**(code **)(*plVar3 + 0x18))(plVar3,*puVar5);
          }
        }
      }
      *puVar5 = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x178) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x180) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 400) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x194) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x198) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x19c) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x1a0) = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x1a8) = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x170) = 0;
    }
    local_144 = 0;
  }
  return local_144;
}

Assistant:

int DeconvolutionDepthWise_x86_avx::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}